

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O2

void __thiscall Js::ConstructorCache::EnableAfterTypeUpdate(ConstructorCache *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  DynamicTypeHandler *pDVar6;
  DynamicType *value;
  
  bVar3 = IsConsistent(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x89,"(IsConsistent())","IsConsistent()");
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
  }
  if (((this->content).field_0x14 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8a,"(this->content.isPopulated)","this->content.isPopulated");
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
  }
  uVar5 = (this->super_PropertyGuard).value;
  if (1 < uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8b,"(!IsEnabled())","!IsEnabled()");
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
    uVar5 = (this->super_PropertyGuard).value;
  }
  if (uVar5 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8c,
                                "((CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special)"
                                ,
                                "(CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special"
                               );
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
  }
  if (((this->content).field_0x14 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8d,"(this->content.typeUpdatePending)",
                                "this->content.typeUpdatePending");
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
  }
  value = (this->content).pendingType.ptr;
  pDVar6 = (value->typeHandler).ptr;
  if ((this->content).slotCount != pDVar6->slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8e,
                                "(this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity())"
                                ,
                                "this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity()"
                               );
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
    value = (this->content).pendingType.ptr;
    pDVar6 = (value->typeHandler).ptr;
  }
  if ((int)(this->content).inlineSlotCount != (uint)pDVar6->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x8f,
                                "(this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
    value = (this->content).pendingType.ptr;
  }
  if (value->isShared == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x90,"(this->content.pendingType->GetIsShared())",
                                "this->content.pendingType->GetIsShared()");
    if (!bVar3) goto LAB_00884280;
    *puVar4 = 0;
    value = (this->content).pendingType.ptr;
  }
  PropertyGuard::SetValue(&this->super_PropertyGuard,(intptr_t)value);
  bVar1 = (this->content).field_0x14;
  (this->content).pendingType.ptr = (DynamicType *)0x0;
  (this->content).field_0x14 = bVar1 & 0xdb | 0x20;
  bVar3 = IsConsistent(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x96,"(IsConsistent())","IsConsistent()");
    if (!bVar3) {
LAB_00884280:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ConstructorCache::EnableAfterTypeUpdate()
    {
        Assert(IsConsistent());
        Assert(this->content.isPopulated);
        Assert(!IsEnabled());
        Assert((CtorCacheGuardValues)this->GetValue() == CtorCacheGuardValues::Special);
        Assert(this->content.typeUpdatePending);
        Assert(this->content.slotCount == this->content.pendingType->GetTypeHandler()->GetSlotCapacity());
        Assert(this->content.inlineSlotCount == this->content.pendingType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(this->content.pendingType->GetIsShared());
        DynamicType* pendingType = this->content.pendingType;
        this->SetValue((intptr_t)pendingType);
        this->content.typeIsFinal = true;
        this->content.pendingType = nullptr;
        this->content.typeUpdatePending = false;
        Assert(IsConsistent());
    }